

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

char * unescape_word(Curl_easy *data,char *inputbuff)

{
  byte *pbVar1;
  CURLcode CVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  char *newp;
  size_t len;
  byte *local_20;
  size_t local_18;
  
  local_20 = (byte *)0x0;
  pcVar4 = (char *)0x0;
  CVar2 = Curl_urldecode(data,inputbuff,0,(char **)&local_20,&local_18,false);
  if ((local_20 != (byte *)0x0) && (CVar2 == CURLE_OK)) {
    pcVar4 = (char *)(*Curl_cmalloc)(local_18 * 2 + 1);
    if (pcVar4 != (char *)0x0) {
      bVar6 = *local_20;
      uVar5 = 0;
      pbVar1 = local_20;
      if (bVar6 != 0) {
        do {
          iVar3 = (int)uVar5;
          if (((byte)(bVar6 + 0x81) < 0xa2) ||
             ((bVar6 - 0x22 < 0x3b &&
              ((0x400000000000021U >> ((ulong)(bVar6 - 0x22) & 0x3f) & 1) != 0)))) {
            lVar7 = (long)iVar3;
            iVar3 = iVar3 + 1;
            pcVar4[lVar7] = '\\';
          }
          uVar5 = (ulong)(iVar3 + 1U);
          pcVar4[iVar3] = bVar6;
          bVar6 = pbVar1[1];
          pbVar1 = pbVar1 + 1;
        } while (bVar6 != 0);
        uVar5 = (ulong)(int)(iVar3 + 1U);
      }
      pcVar4[uVar5] = '\0';
    }
    (*Curl_cfree)(local_20);
  }
  return pcVar4;
}

Assistant:

static char *unescape_word(struct Curl_easy *data, const char *inputbuff)
{
  char *newp = NULL;
  char *dictp;
  size_t len;

  CURLcode result = Curl_urldecode(data, inputbuff, 0, &newp, &len, FALSE);
  if(!newp || result)
    return NULL;

  dictp = malloc(len*2 + 1); /* add one for terminating zero */
  if(dictp) {
    char *ptr;
    char ch;
    int olen = 0;
    /* According to RFC2229 section 2.2, these letters need to be escaped with
       \[letter] */
    for(ptr = newp;
        (ch = *ptr) != 0;
        ptr++) {
      if((ch <= 32) || (ch == 127) ||
          (ch == '\'') || (ch == '\"') || (ch == '\\')) {
        dictp[olen++] = '\\';
      }
      dictp[olen++] = ch;
    }
    dictp[olen] = 0;
  }
  free(newp);
  return dictp;
}